

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type,bool user_facing_type)

{
  EnumDef *def;
  BaseType BVar1;
  undefined7 in_register_00000009;
  char *__s;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000009,user_facing_type) == 0) {
    BVar1 = type->base_type;
  }
  else {
    def = type->enum_def;
    if (def != (EnumDef *)0x0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
      BaseGenerator::WrapInNameSpace
                (__return_storage_ptr__,&this->super_BaseGenerator,&def->super_Definition,&local_48)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    BVar1 = type->base_type;
    if (BVar1 == BASE_TYPE_BOOL) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"bool","");
      return __return_storage_ptr__;
    }
  }
  if (BVar1 == BASE_TYPE_UTYPE) {
    if (type->enum_def == (EnumDef *)0x0) {
      __s = "uint8_t";
      goto LAB_00177c08;
    }
    BVar1 = (type->enum_def->underlying_type).base_type;
  }
  if (BASE_TYPE_VECTOR64 < BVar1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0xb5,"const char *flatbuffers::StringOf(const BaseType)");
  }
  __s = &DAT_0035d948 + *(int *)(&DAT_0035d948 + (ulong)BVar1 * 4);
LAB_00177c08:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const Type &type, bool user_facing_type) const {
    if (user_facing_type) {
      if (type.enum_def) return WrapInNameSpace(*type.enum_def);
      if (type.base_type == BASE_TYPE_BOOL) return "bool";
    }
    // Get real underlying type for union type
    auto base_type = type.base_type;
    if (type.base_type == BASE_TYPE_UTYPE && type.enum_def != nullptr) {
      base_type = type.enum_def->underlying_type.base_type;
    }
    return StringOf(base_type);
  }